

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O3

ostream * lambda::operator<<(ostream *os,Parse_error *e)

{
  char *__s;
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Parse error: ",0xd);
  __s = (char *)(**(code **)(*(long *)e + 0x10))(e);
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Parse_error const& e) {
  return os << "Parse error: " << e.what();
}